

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O1

void Pdr_ManCollectCone_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vCiObjs,Vec_Int_t *vNodes)

{
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                  ,0x50,
                  "void Pdr_ManCollectCone_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)")
    ;
  }
  if (pObj->TravId == pAig->nTravIds) {
    return;
  }
  pObj->TravId = pAig->nTravIds;
  if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
    Pdr_ManCollectCone_rec
              (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vCiObjs,vNodes);
    if ((*(uint *)&pObj->field_0x18 & 7) == 3) {
      return;
    }
    Pdr_ManCollectCone_rec
              (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vCiObjs,vNodes);
    vCiObjs = vNodes;
  }
  Vec_IntPush(vCiObjs,pObj->Id);
  return;
}

Assistant:

void Pdr_ManCollectCone_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vCiObjs, Vec_Int_t * vNodes )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_IntPush( vCiObjs, Aig_ObjId(pObj) );
        return;
    }
    Pdr_ManCollectCone_rec( pAig, Aig_ObjFanin0(pObj), vCiObjs, vNodes );
    if ( Aig_ObjIsCo(pObj) )
        return;
    Pdr_ManCollectCone_rec( pAig, Aig_ObjFanin1(pObj), vCiObjs, vNodes );
    Vec_IntPush( vNodes, Aig_ObjId(pObj) );
}